

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

int Bmcs_ManPerform_Solve
              (Bmcs_Man_t *p,int iLit,pthread_t *WorkerThread,Par_ThData_t *ThData,int nProcs,
              int *pSolver)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = 0;
  if (0 < nProcs) {
    uVar5 = (ulong)(uint)nProcs;
  }
  lVar1 = uVar5 * 0x18 + 0x18;
  lVar4 = 0;
  while (lVar1 != lVar4 + 0x18) {
    *(int *)((long)&ThData->iLit + lVar4) = iLit;
    piVar3 = (int *)((long)&ThData->fWorking + lVar4);
    lVar4 = lVar4 + 0x18;
    if (*piVar3 != 0) {
      __assert_fail("ThData[i].fWorking == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x306,
                    "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                   );
    }
  }
  for (lVar4 = 0; uVar5 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    *(undefined4 *)((long)&ThData->fWorking + lVar4) = 1;
  }
  iVar2 = -1;
  uVar6 = uVar5;
  do {
    if ((int)uVar6 != nProcs) {
      lVar4 = 0;
      do {
        if (lVar1 == lVar4 + 0x18) {
          p->fStopNow = 0;
          return iVar2;
        }
        *(undefined4 *)((long)&ThData->iLit + lVar4) = 0xffffffff;
        piVar3 = (int *)((long)&ThData->fWorking + lVar4);
        lVar4 = lVar4 + 0x18;
      } while (*piVar3 == 0);
      __assert_fail("ThData[i].fWorking == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x325,
                    "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                   );
    }
    piVar3 = &ThData->status;
    for (uVar7 = 0; uVar6 = uVar5, uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (piVar3[-1] == 0) {
        p->fStopNow = 1;
        iVar2 = *piVar3;
        *pSolver = (int)uVar7;
        uVar6 = uVar7;
        break;
      }
      piVar3 = piVar3 + 6;
    }
  } while( true );
}

Assistant:

int Bmcs_ManPerform_Solve( Bmcs_Man_t * p, int iLit, pthread_t * WorkerThread, Par_ThData_t * ThData, int nProcs, int * pSolver )
{
    int i, status = -1;
    // set new problem
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = iLit;
        assert( ThData[i].fWorking == 0 );
    }
    // start solvers on a new problem
    for ( i = 0; i < nProcs; i++ )
        ThData[i].fWorking = 1;
    // check if any of the solvers finished
    while ( i == nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].fWorking )
                continue;
            // set stop request
            p->fStopNow = 1;
            // remember status
            status = ThData[i].status;
            //printf( "Solver %d returned status %d.\n", i, status );
            *pSolver = i;
            break;
        }
    }
    // wait till threads finish
    while ( i < nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].fWorking )
                break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = -1;
        assert( ThData[i].fWorking == 0 );
    }
    // reset stop request
    p->fStopNow = 0;
    return status;
}